

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O1

bool __thiscall
binlog::SessionWriter::addEvent<std::vector<int,std::allocator<int>>>
          (SessionWriter *this,uint64_t eventSourceId,uint64_t clock,
          vector<int,_std::allocator<int>_> *args)

{
  char **ppcVar1;
  Queue *pQVar2;
  long lVar3;
  size_t sVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  size_t sizes [3];
  long local_48 [3];
  
  local_48[0] = 8;
  local_48[1] = 8;
  local_48[2] = (long)(args->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish +
                (4 - (long)(args->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start);
  lVar7 = 0;
  lVar3 = 0;
  do {
    lVar7 = lVar7 + *(long *)((long)local_48 + lVar3);
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x18);
  uVar8 = lVar7 + 4;
  if ((ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < uVar8) {
    sVar4 = detail::QueueWriter::maximizeWriteCapacity(&this->_qw);
    if (((sVar4 < uVar8) &&
        (replaceChannel(this,uVar8),
        (ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < uVar8)) &&
       (sVar4 = detail::QueueWriter::maximizeWriteCapacity(&this->_qw), sVar4 < uVar8)) {
      return false;
    }
  }
  *(int *)(this->_qw)._writePos = (int)lVar7;
  pcVar6 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar6 + 4;
  *(uint64_t *)(pcVar6 + 4) = eventSourceId;
  pcVar6 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar6 + 8;
  *(uint64_t *)(pcVar6 + 8) = clock;
  pcVar6 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar6 + 8;
  uVar8 = (long)(args->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(args->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
  iVar5 = (int)(uVar8 >> 2);
  *(int *)(pcVar6 + 8) = iVar5;
  pcVar6 = (this->_qw)._writePos + 4;
  (this->_qw)._writePos = pcVar6;
  if (iVar5 != 0) {
    uVar8 = uVar8 & 0x3fffffffc;
    memcpy(pcVar6,(args->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start,uVar8);
    ppcVar1 = &(this->_qw)._writePos;
    *ppcVar1 = *ppcVar1 + uVar8;
  }
  pQVar2 = (this->_qw)._queue;
  (pQVar2->writeIndex).super___atomic_base<unsigned_long>._M_i =
       (long)(this->_qw)._writePos - (long)pQVar2->buffer;
  return true;
}

Assistant:

bool SessionWriter::addEvent(std::uint64_t eventSourceId, std::uint64_t clock, Args&&... args) noexcept
{
  // compute size (excludes size field)
  std::size_t size = 0;
  const std::size_t sizes[] = {sizeof(eventSourceId), sizeof(clock), mserialize::serialized_size(args)...};
  for (auto s : sizes) { size += s; }

  // allocate space (totalSize includes size field)
  const std::size_t totalSize = size + sizeof(std::uint32_t);
  if (! _qw.beginWrite(totalSize))
  {
    // not enough space in queue, create a new channel
    replaceChannel(totalSize);
    if (! _qw.beginWrite(totalSize)) { return false; }
  }

  // serialize fields
  using swallow = int[];
  (void)swallow{
    (mserialize::serialize(std::uint32_t(size), _qw), int{}),
    (mserialize::serialize(eventSourceId, _qw), int{}),
    (mserialize::serialize(clock, _qw), int{}),
    (mserialize::serialize(args, _qw), int{})...
  };

  _qw.endWrite();
  return true;
}